

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long_long&,unsigned_long_long&>&,char_const(&)[19],unsigned_long_long&,unsigned_long_long&>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          DebugComparison<unsigned_long_long_&,_unsigned_long_long_&> *params,char (*params_1) [19],
          unsigned_long_long *params_2,unsigned_long_long *params_3)

{
  long lVar1;
  undefined8 uVar2;
  char *pcVar3;
  undefined4 in_register_00000014;
  ArrayPtr<const_char> *params_00;
  CappedArray<char,_26UL> *params_01;
  CappedArray<char,_26UL> *params_02;
  long lVar4;
  CappedArray<char,_26UL> *this_00;
  CappedArray<char,_26UL> *__return_storage_ptr__;
  String argValues [4];
  size_t *psVar5;
  undefined8 uVar6;
  size_t local_b8;
  char local_b0 [8];
  char acStack_a8 [8];
  String local_a0;
  String local_88;
  String local_70;
  CappedArray<char,_26UL> local_58;
  
  this->exception = (Exception *)0x0;
  _::operator*(&local_58,params,CONCAT44(in_register_00000014,line));
  this_00 = &local_58;
  local_b8 = local_58.currentSize;
  local_b0[0] = local_58.content[0];
  local_b0[1] = local_58.content[1];
  local_b0[2] = local_58.content[2];
  local_b0[3] = local_58.content[3];
  local_b0[4] = local_58.content[4];
  local_b0[5] = local_58.content[5];
  local_b0[6] = local_58.content[6];
  local_b0[7] = local_58.content[7];
  acStack_a8[0] = local_58.content[8];
  acStack_a8[1] = local_58.content[9];
  acStack_a8[2] = local_58.content[10];
  acStack_a8[3] = local_58.content[0xb];
  acStack_a8[4] = local_58.content[0xc];
  acStack_a8[5] = local_58.content[0xd];
  acStack_a8[6] = local_58.content[0xe];
  acStack_a8[7] = local_58.content[0xf];
  local_58.content._0_8_ = strlen(*params_1);
  local_58.currentSize = (size_t)params_1;
  concat<kj::ArrayPtr<char_const>>(&local_a0,(_ *)this_00,params_00);
  __return_storage_ptr__ = &local_58;
  Stringifier::operator*(__return_storage_ptr__,(Stringifier *)this_00,*params_2);
  concat<kj::CappedArray<char,26ul>>(&local_88,(_ *)__return_storage_ptr__,params_01);
  Stringifier::operator*(&local_58,(Stringifier *)__return_storage_ptr__,*params_3);
  concat<kj::CappedArray<char,26ul>>(&local_70,(_ *)&local_58,params_02);
  psVar5 = &local_b8;
  uVar6 = 4;
  init(this,(EVP_PKEY_CTX *)file);
  lVar4 = 0x48;
  do {
    lVar1 = *(long *)((long)&local_b8 + lVar4);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)(local_b0 + lVar4);
      *(undefined8 *)((long)&local_b8 + lVar4) = 0;
      pcVar3 = local_b0 + lVar4;
      pcVar3[0] = '\0';
      pcVar3[1] = '\0';
      pcVar3[2] = '\0';
      pcVar3[3] = '\0';
      pcVar3[4] = '\0';
      pcVar3[5] = '\0';
      pcVar3[6] = '\0';
      pcVar3[7] = '\0';
      (**(code **)**(undefined8 **)(acStack_a8 + lVar4))
                (*(undefined8 **)(acStack_a8 + lVar4),lVar1,1,uVar2,uVar2,0,psVar5,uVar6);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}